

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltable.c
# Opt level: O2

RaviArray * raviH_new_slice(lua_State *L,TValue *parent,uint start,uint len)

{
  RaviArray *pRVar1;
  RaviArray *pRVar2;
  char *fmt;
  
  if ((parent->tt_ == 0x8015) || (parent->tt_ == 0x8025)) {
    pRVar1 = (RaviArray *)(parent->value_).f;
    if ((pRVar1->tt != '\x15') && (pRVar1->tt != '%')) {
      __assert_fail("((((parent)->value_).gc)->tt == ((5) | ((1) << 4)) || (((parent)->value_).gc)->tt == ((5) | ((2) << 4)))"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltable.c"
                    ,0x3cd,
                    "RaviArray *raviH_new_slice(lua_State *, TValue *, unsigned int, unsigned int)")
      ;
    }
    if ((pRVar1->flags & 2) != 0) {
      pRVar2 = raviH_new(L,((pRVar1->flags & 8) >> 3) * 0x20 + 0x20,1);
      (pRVar2->field_6).parent = pRVar1;
      pRVar2->data = pRVar1->data + (ulong)start * 8 + -8;
      pRVar2->len = len + 1;
      pRVar2->size = len + 1;
      return pRVar2;
    }
    fmt = "cannot create slice from dynamic integer[] or number[] array";
  }
  else {
    fmt = "integer[] or number[] expected";
  }
  luaG_runerror(L,fmt);
}

Assistant:

RaviArray *raviH_new_slice(lua_State *L, TValue *parent, unsigned int start,
                       unsigned int len) {
  if (!ttisarray(parent))
    luaG_runerror(L, "integer[] or number[] expected");
  RaviArray *orig = arrvalue(parent);
  if ((orig->flags & RAVI_ARRAY_FIXEDSIZE) == 0)
    luaG_runerror(
        L, "cannot create slice from dynamic integer[] or number[] array");
  /* Create the slice table */
  RaviArray *t = raviH_new(L, (orig->flags & RAVI_ARRAY_ISFLOAT) ? RAVI_TM_FLOAT_ARRAY : RAVI_TM_INTEGER_ARRAY, 1);
  /* Add a reference to the parent table. From GC perspective the slice is a white object
     so we do not need a write barrier */
  t->parent = orig;
  /* Initialize */
  if (orig->flags & RAVI_ARRAY_ISFLOAT) {
    lua_Number *data = (lua_Number *)orig->data;
    t->data = (char *)(data + start - 1);
  }
  else {
    lua_Integer *data = (lua_Integer *)orig->data;
    t->data = (char *)(data + start - 1);
  }
  t->len = len + 1;
  t->size = len + 1;
  return t;
}